

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

void __thiscall bidfx_public_api::tools::Date::Date(Date *this,int year,int month,int day)

{
  invalid_argument *this_00;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((uint)month < 0xd) {
    if ((0x15aaU >> (month & 0x1fU) & 1) == 0) {
      if ((0xa50U >> (month & 0x1fU) & 1) == 0) {
        if ((month != 2) || (0x1d < day)) goto LAB_001a1d4f;
      }
      else if (0x1e < day) goto LAB_001a1d4f;
    }
    else if (0x1f < day) goto LAB_001a1d4f;
    if (year - 0x7e2U < 0x3d6) {
      this->year_ = year;
      this->month_ = month;
      this->day_ = day;
      return;
    }
  }
LAB_001a1d4f:
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Date is invalid: ","");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ToString_abi_cxx11_(&local_60,this);
  std::operator+(&local_40,&local_80,&local_60);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Date::Date(int year, int month, int day)
{
    if (IsValidDate(year, month, day))
    {
        year_ = year;
        month_ = month;
        day_ = day;
    }
    else
    {
        std::string error = "Date is invalid: ";

        throw std::invalid_argument(error + ToString());
    }
}